

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::BuiltinPrecisionTests::
Func<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_3,_4>,_tcu::Matrix<float,_4,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
::doPrint(Func<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_3,_4>,_tcu::Matrix<float,_4,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *this,ostream *os,BaseArgExprs *args)

{
  BaseArgExprs *os_00;
  bool bVar1;
  ostream *poVar2;
  const_reference ppEVar3;
  string local_40 [32];
  BaseArgExprs *local_20;
  BaseArgExprs *args_local;
  ostream *os_local;
  Func<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_3,_4>,_tcu::Matrix<float,_4,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *this_local;
  
  local_20 = args;
  args_local = (BaseArgExprs *)os;
  os_local = (ostream *)this;
  (**(code **)(*(long *)this + 0x10))();
  poVar2 = std::operator<<(os,local_40);
  std::operator<<(poVar2,"(");
  std::__cxx11::string::~string(local_40);
  bVar1 = isTypeValid<tcu::Matrix<float,4,3>>();
  os_00 = args_local;
  if (bVar1) {
    ppEVar3 = std::
              vector<const_deqp::gls::BuiltinPrecisionTests::ExprBase_*,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::ExprBase_*>_>
              ::operator[](local_20,0);
    BuiltinPrecisionTests::operator<<((ostream *)os_00,*ppEVar3);
  }
  bVar1 = isTypeValid<deqp::gls::BuiltinPrecisionTests::Void>();
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)args_local,", ");
    ppEVar3 = std::
              vector<const_deqp::gls::BuiltinPrecisionTests::ExprBase_*,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::ExprBase_*>_>
              ::operator[](local_20,1);
    BuiltinPrecisionTests::operator<<(poVar2,*ppEVar3);
  }
  bVar1 = isTypeValid<deqp::gls::BuiltinPrecisionTests::Void>();
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)args_local,", ");
    ppEVar3 = std::
              vector<const_deqp::gls::BuiltinPrecisionTests::ExprBase_*,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::ExprBase_*>_>
              ::operator[](local_20,2);
    BuiltinPrecisionTests::operator<<(poVar2,*ppEVar3);
  }
  bVar1 = isTypeValid<deqp::gls::BuiltinPrecisionTests::Void>();
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)args_local,", ");
    ppEVar3 = std::
              vector<const_deqp::gls::BuiltinPrecisionTests::ExprBase_*,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::ExprBase_*>_>
              ::operator[](local_20,3);
    BuiltinPrecisionTests::operator<<(poVar2,*ppEVar3);
  }
  std::operator<<((ostream *)args_local,")");
  return;
}

Assistant:

virtual void		doPrint			(ostream& os, const BaseArgExprs& args)	const
	{
		os << getName() << "(";

		if (isTypeValid<Arg0>())
			os << *args[0];

		if (isTypeValid<Arg1>())
			os << ", " << *args[1];

		if (isTypeValid<Arg2>())
			os << ", " << *args[2];

		if (isTypeValid<Arg3>())
			os << ", " << *args[3];

		os << ")";
	}